

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_decompress_double_precision(uint32_t *number_of_doubles,double **out,uint8_t *compressed)

{
  byte bVar1;
  byte bVar2;
  void *__ptr;
  void *pvVar3;
  double *pdVar4;
  double *pdVar5;
  sbyte sVar6;
  sbyte sVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  ulong uVar15;
  double dVar16;
  double **__ptr_00;
  ulong uVar17;
  byte *pbVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint64_t xor [2];
  uint64_t bcode [2];
  ulong local_a8 [2];
  double **local_98;
  double local_90;
  double *local_88;
  ulong local_80;
  byte *local_78;
  void *local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong auStack_48 [3];
  
  bVar1 = *compressed;
  uVar10 = bVar1 >> 3 & 0xfffffffe;
  uVar19 = (uint)bVar1 + (uint)bVar1 & 0x1e;
  sVar6 = (sbyte)uVar10;
  sVar7 = (sbyte)uVar19;
  local_60 = (1L << sVar6) - 1;
  local_58 = (1L << sVar7) - 1;
  local_98 = out;
  pvVar3 = calloc(1L << sVar6,8);
  local_70 = calloc(1L << sVar7,8);
  bVar1 = compressed[1];
  *number_of_doubles = (uint)bVar1 << 0x18;
  uVar8 = (uint)compressed[2] << 0x10 | (uint)bVar1 << 0x18;
  *number_of_doubles = uVar8;
  uVar8 = (uint)compressed[3] << 8 | uVar8;
  *number_of_doubles = uVar8;
  local_78 = compressed + 5;
  local_64 = (uint)compressed[4];
  uVar8 = uVar8 | local_64;
  *number_of_doubles = uVar8;
  pdVar4 = (double *)malloc((ulong)uVar8 * 8);
  __ptr = local_70;
  *local_98 = pdVar4;
  local_88 = (double *)0x0;
  local_98 = (double **)pvVar3;
  auStack_48[2] = (ulong)uVar19;
  if (uVar8 < 2) {
    local_88 = pdVar4;
    uVar17 = 0;
    local_80 = 0;
    uVar15 = 0;
    uVar9 = 0;
    local_90 = 0.0;
    __ptr_00 = (double **)pvVar3;
    uVar21 = (ulong)uVar10;
  }
  else {
    uVar8 = (uVar8 >> 1) + (uint)(uVar8 >> 1 == 0);
    local_90 = (double)(ulong)uVar8;
    local_90 = 0.0;
    uVar9 = 0;
    uVar15 = 0;
    local_80 = 0;
    uVar17 = 0;
    local_50 = (ulong)uVar10;
    do {
      pdVar5 = pdVar4;
      bVar1 = *local_78;
      local_78 = local_78 + 1;
      lVar20 = 0;
      do {
        uVar10 = bVar1 >> ((byte)lVar20 & 0x3f) & 0xf;
        *(ulong *)((long)auStack_48 + lVar20 * 2) = (ulong)uVar10;
        switch(uVar10) {
        case 0:
          *(undefined8 *)((long)local_a8 + lVar20 * 2) = 0;
          goto LAB_00108e85;
        default:
          uVar13 = (ulong)*local_78;
          local_78 = local_78 + 1;
          goto LAB_00108dfc;
        case 2:
        case 10:
          uVar21 = (ulong)*local_78 << 8;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[1];
          local_78 = local_78 + 2;
          break;
        case 3:
        case 0xb:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x10;
          uVar21 = (ulong)((uint)local_78[1] << 8 | (uint)((ulong)bVar2 << 0x10));
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[2];
          local_78 = local_78 + 3;
          goto LAB_00108df9;
        case 4:
        case 0xc:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x18;
          uVar10 = (uint)local_78[1] << 0x10 | (uint)((ulong)bVar2 << 0x18);
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)uVar10;
          uVar21 = (ulong)((uint)local_78[2] << 8 | uVar10);
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[3];
          local_78 = local_78 + 4;
          break;
        case 5:
        case 0xd:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x20;
          uVar21 = (ulong)local_78[1] << 0x18 | (ulong)bVar2 << 0x20;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[2] << 0x10 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[3] << 8 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[4];
          local_78 = local_78 + 5;
          goto LAB_00108df9;
        case 6:
        case 0xe:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x28;
          uVar21 = (ulong)local_78[1] << 0x20 | (ulong)bVar2 << 0x28;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[2] << 0x18 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[3] << 0x10 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[4] << 8 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[5];
          local_78 = local_78 + 6;
          break;
        case 7:
        case 0xf:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x30;
          uVar21 = (ulong)local_78[1] << 0x28 | (ulong)bVar2 << 0x30;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[2] << 0x20 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[3] << 0x18 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[4] << 0x10 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[5] << 8 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[6];
          local_78 = local_78 + 7;
LAB_00108df9:
          uVar13 = uVar13 | uVar21;
LAB_00108dfc:
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar13;
          goto LAB_00108e85;
        case 8:
          bVar2 = *local_78;
          *(ulong *)((long)local_a8 + lVar20 * 2) = (ulong)bVar2 << 0x38;
          uVar21 = (ulong)local_78[1] << 0x30 | (ulong)bVar2 << 0x38;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[2] << 0x28 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[3] << 0x20 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[4] << 0x18 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[5] << 0x10 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar21 = (ulong)local_78[6] << 8 | uVar21;
          *(ulong *)((long)local_a8 + lVar20 * 2) = uVar21;
          uVar13 = (ulong)local_78[7];
          local_78 = local_78 + 8;
        }
        *(ulong *)((long)local_a8 + lVar20 * 2) = uVar13 | uVar21;
LAB_00108e85:
        lVar20 = lVar20 + 4;
      } while (lVar20 == 4);
      lVar20 = 0;
      dVar14 = local_90;
      do {
        if (*(ulong *)((long)auStack_48 + lVar20) < 9) {
          uVar9 = local_80;
        }
        local_90 = (double)(uVar9 ^ *(ulong *)((long)local_a8 + lVar20));
        *(double *)((long)pvVar3 + uVar17 * 8) = local_90;
        uVar17 = (uVar17 << sVar6 ^ (ulong)local_90 >> (0x40U - sVar6 & 0x3f)) & local_60;
        *(long *)((long)local_70 + uVar15 * 8) = (long)local_90 - (long)dVar14;
        local_80 = *(ulong *)((long)pvVar3 + uVar17 * 8);
        uVar15 = (uVar15 << (sbyte)(uVar19 >> 1) ^
                 (ulong)((long)local_90 - (long)dVar14) >> (0x40U - sVar7 & 0x3f)) & local_58;
        uVar9 = *(long *)((long)local_70 + uVar15 * 8) + (long)local_90;
        *(double *)((long)pdVar5 + lVar20) = local_90;
        lVar20 = lVar20 + 8;
        dVar14 = local_90;
      } while (lVar20 == 8);
      uVar10 = (int)local_88 + 1;
      local_88 = (double *)(ulong)uVar10;
      pdVar4 = (double *)((long)pdVar5 + lVar20);
    } while (uVar10 != uVar8);
    local_88 = (double *)((long)pdVar5 + lVar20);
    __ptr_00 = local_98;
    uVar21 = local_50;
  }
  if ((local_64 & 1) == 0) goto LAB_00109048;
  pbVar18 = local_78 + 1;
  lVar20 = 2;
  uVar8 = *local_78 & 0xf;
  auStack_48[0] = (ulong)uVar8;
  switch(uVar8) {
  case 0:
    local_a8[0] = 0;
    goto LAB_00109299;
  case 1:
    local_a8[0] = (ulong)*pbVar18;
    lVar20 = 2;
    if ((ulong)*pbVar18 == 0) {
      lVar20 = 0;
    }
    goto LAB_00109299;
  default:
    uVar13 = (ulong)*pbVar18 << 8;
    uVar12 = (ulong)local_78[2];
    break;
  case 3:
  case 0xb:
    uVar13 = (ulong)((uint)local_78[2] << 8 | (uint)*pbVar18 << 0x10);
    local_a8[0] = (ulong)local_78[3];
    goto LAB_00109292;
  case 4:
  case 0xc:
    uVar13 = (ulong)((uint)local_78[3] << 8 | (uint)local_78[2] << 0x10 | (uint)*pbVar18 << 0x18);
    uVar12 = (ulong)local_78[4];
    break;
  case 5:
  case 0xd:
    uVar13 = (ulong)local_78[4] << 8 |
             (ulong)local_78[3] << 0x10 | (ulong)local_78[2] << 0x18 | (ulong)*pbVar18 << 0x20;
    local_a8[0] = (ulong)local_78[5];
    goto LAB_00109292;
  case 6:
  case 0xe:
    uVar13 = (ulong)local_78[5] << 8 |
             (ulong)local_78[4] << 0x10 |
             (ulong)local_78[3] << 0x18 | (ulong)local_78[2] << 0x20 | (ulong)*pbVar18 << 0x28;
    uVar12 = (ulong)local_78[6];
    break;
  case 7:
  case 0xf:
    uVar13 = (ulong)local_78[6] << 8 |
             (ulong)local_78[5] << 0x10 |
             (ulong)local_78[4] << 0x18 |
             (ulong)local_78[3] << 0x20 | (ulong)local_78[2] << 0x28 | (ulong)*pbVar18 << 0x30;
    local_a8[0] = (ulong)local_78[7];
LAB_00109292:
    local_a8[0] = local_a8[0] | uVar13;
LAB_00109295:
    goto LAB_00109299;
  case 8:
    uVar13 = (ulong)local_78[7] << 8 |
             (ulong)local_78[6] << 0x10 |
             (ulong)local_78[5] << 0x18 |
             (ulong)local_78[4] << 0x20 |
             (ulong)local_78[3] << 0x28 | (ulong)local_78[2] << 0x30 | (ulong)*pbVar18 << 0x38;
    uVar12 = (ulong)local_78[8];
    break;
  case 9:
    local_a8[0] = (ulong)*pbVar18;
    goto LAB_00109295;
  }
  local_a8[0] = uVar12 | uVar13;
LAB_00109299:
  if (1 < (uint)lVar20) {
    auStack_48[1] = (ulong)(*local_78 >> 4);
    (*(code *)((long)&switchD_00108f95::switchdataD_0011b6f4 +
              (long)(int)(&switchD_00108f95::switchdataD_0011b6f4)[auStack_48[1]]))();
    return;
  }
  if ((uint)lVar20 != 0) {
    lVar11 = 0;
    uVar13 = local_80;
    dVar14 = local_90;
    do {
      if (auStack_48[lVar11] < 9) {
        uVar9 = uVar13;
      }
      dVar16 = (double)(uVar9 ^ local_a8[lVar11]);
      *(double *)((long)__ptr_00 + uVar17 * 8) = dVar16;
      uVar17 = ((ulong)dVar16 >> (0x40U - (sbyte)uVar21 & 0x3f) ^ uVar17 << (sbyte)uVar21) &
               local_60;
      *(long *)((long)local_70 + uVar15 * 8) = (long)dVar16 - (long)dVar14;
      uVar13 = *(ulong *)((long)pvVar3 + uVar17 * 8);
      uVar15 = ((ulong)((long)dVar16 - (long)dVar14) >> (0x40U - sVar7 & 0x3f) ^
               uVar15 << (sbyte)(uVar19 >> 1)) & local_58;
      uVar9 = *(long *)((long)local_70 + uVar15 * 8) + (long)dVar16;
      local_88[lVar11] = dVar16;
      lVar11 = lVar11 + 1;
      dVar14 = dVar16;
      __ptr_00 = (double **)pvVar3;
    } while (lVar20 != lVar11);
  }
LAB_00109048:
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void trico_decompress_double_precision(uint32_t* number_of_doubles, double** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint64_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint64_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  *number_of_doubles = ((uint32_t)(*compressed++)) << 24;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 16;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 8;
  *number_of_doubles |= ((uint32_t)(*compressed++));
  *out = (double*)trico_malloc(*number_of_doubles * sizeof(double));

  uint64_t bc;
  uint64_t bcode[2];
  uint64_t xor[2];
  uint64_t value;
  uint64_t hash1 = 0;
  uint64_t prediction1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction2 = 0;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t* p_out = (uint64_t*)(*out);

  const uint32_t cnt = *number_of_doubles / 2;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++));
    for (int j = 0; j < 2; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 2; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_doubles & 1)
    {
    bc = ((uint32_t)(*compressed++));
    int max_j = 2;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }